

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_analysis.cc
# Opt level: O0

void __thiscall
tchecker::clock_updates_visitor_t::visit(clock_updates_visitor_t *this,typed_if_statement_t *stmt)

{
  typed_statement_t *ptVar1;
  undefined1 local_40 [8];
  clock_updates_visitor_t v;
  typed_if_statement_t *stmt_local;
  clock_updates_visitor_t *this_local;
  
  v._loop_depth = (size_t)stmt;
  clock_updates_visitor_t((clock_updates_visitor_t *)local_40,this);
  ptVar1 = typed_if_statement_t::then_stmt((typed_if_statement_t *)v._loop_depth);
  (**(code **)(*(long *)ptVar1 + 0x30))(ptVar1,this);
  ptVar1 = typed_if_statement_t::else_stmt((typed_if_statement_t *)v._loop_depth);
  (**(code **)(*(long *)ptVar1 + 0x30))(ptVar1,local_40);
  clock_updates_map_t::absorbing_merge(&this->_u,(clock_updates_map_t *)&v);
  ~clock_updates_visitor_t((clock_updates_visitor_t *)local_40);
  return;
}

Assistant:

virtual void visit(tchecker::typed_if_statement_t const & stmt)
  {
    tchecker::clock_updates_visitor_t v(*this);
    stmt.then_stmt().visit(*this);
    stmt.else_stmt().visit(v);
    _u.absorbing_merge(v._u);
  }